

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O2

bool __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::solve
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,ColVectorType *b,Heuristic heuristic
          )

{
  RowVectorType *this_00;
  RowVectorType *this_01;
  PermutationType *this_02;
  float fVar1;
  Index IVar2;
  bool bVar3;
  bool bVar4;
  Index IVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  long lVar8;
  Index i;
  long lVar9;
  Scalar SVar10;
  float fVar11;
  Index remIdx;
  float local_84;
  Index local_58;
  MatrixType *local_48;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  this->_num_ls = 0;
  this_00 = &this->_x;
  DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)this_00);
  this_02 = &this->_P;
  PermutationBase<Eigen::PermutationMatrix<-1,_-1,_long>_>::setIdentity
            ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_long>_> *)this_02);
  this->_Np = 0;
  local_48 = &this->_A;
  local_40 = MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)
                        &local_48,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)b);
  internal::
  call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
            (&this->_Atb,&local_40);
  this_01 = &this->_y;
  do {
    _updateGradient(this);
    if (((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         == this->_Np) || (SVar10 = _max_Z(this,&this->_w), SVar10 < this->_epsilon)) {
      return true;
    }
    if (heuristic == MAX_DESCENT) {
      IVar5 = _argmax_Z(this,&this->_w);
      _addToP(this,IVar5);
    }
    while( true ) {
      if ((0 < this->_max_iter) && (this->_max_iter <= this->_num_ls)) {
        return false;
      }
      _solveLS_P(this,b);
      bVar4 = true;
      local_84 = 3.4028235e+38;
      for (lVar9 = 0; lVar8 = this->_Np, lVar9 < lVar8; lVar9 = lVar9 + 1) {
        pSVar6 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)this_02,
                            lVar9);
        IVar2 = *pSVar6;
        pSVar7 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)this_01,
                            IVar2);
        if (*pSVar7 <= 0.0 && *pSVar7 != 0.0) {
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)this_00,
                              IVar2);
          fVar11 = *pSVar7;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)this_01,
                              IVar2);
          fVar1 = *pSVar7;
          pSVar7 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)this_00,
                              IVar2);
          fVar11 = -fVar11 / (fVar1 - *pSVar7);
          bVar3 = local_84 <= fVar11;
          IVar5 = lVar9;
          if (local_84 <= fVar11) {
            fVar11 = local_84;
            IVar5 = local_58;
          }
          local_58 = IVar5;
          bVar4 = (bool)(bVar4 & bVar3);
          local_84 = fVar11;
        }
      }
      if (bVar4) break;
      for (lVar9 = 0; lVar9 < lVar8; lVar9 = lVar9 + 1) {
        pSVar6 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)this_02,
                            lVar9);
        IVar2 = *pSVar6;
        pSVar7 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)this_01,
                            IVar2);
        fVar11 = *pSVar7;
        pSVar7 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)this_00,
                            IVar2);
        fVar1 = *pSVar7;
        pSVar7 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)this_00,
                            IVar2);
        *pSVar7 = (fVar11 - fVar1) * local_84 + *pSVar7;
        lVar8 = this->_Np;
      }
      _remFromP(this,local_58);
    }
    internal::call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (this_00,this_01);
  } while( true );
}

Assistant:

bool NNLS<MatrixType>::solve(const ColVectorType &b, Heuristic heuristic)
{
#ifdef EIGEN3_NNLS_DEBUG
  std::cerr << "NNLS(): Start..." << std::endl;
  _QR.setZero(); _qrCoeffs.setZero();
#endif

  // Initialize solver
  _num_ls = 0; _x.setZero();

  // Together with _Np, P separates the space of coefficients into a active (Z) and passive (P)
  // set. The first _Np elements form the passive set P and the remaining elements form the
  // active set Z.
  _P.setIdentity(); _Np = 0;

  // Precompute A^T*b
  _Atb = _A.transpose() * b;

  // OUTER LOOP
  while (true)
  {
    // Update gradient _w
    _updateGradient();

    // Check if system is solved:
    if ((_A.cols()==_Np) || ((_max_Z(_w)-_epsilon)<0))
      return true;

    switch (heuristic) {
    // find index of max descent and add it to P
    case MAX_DESCENT:
        _addToP(_argmax_Z(_w));
        break;
    }

    // INNER LOOP
    while (true)
    {
      // Check if max. number of iterations is reached
      if ( (0 < _max_iter) && (int(_num_ls) >= _max_iter) )
        return false;

      // Solve LS problem in P only, this step is rather trivial as _addToP & _remFromP
      // updates the QR decomposition of A^P.
      _solveLS_P(b);

      // Check feasability...
      bool feasable = true;
      Scalar alpha = std::numeric_limits<Scalar>::max(); Index remIdx;
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        if (_y(idx) < 0) {
          // t shoudl always be in [0,1].
          Scalar t = -_x(idx)/(_y(idx)-_x(idx));
          if (alpha > t) {
            alpha = t;
            remIdx = i;
            feasable = false;
          }
        }
      }

      // If solution is feasable, exit to outer loop
      if (feasable) {
        _x = _y;
        break;
      }

      // Infeasable solution -> interpolate to feasable one
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        _x(idx) += alpha * (_y(idx) - _x(idx));
      }

      // Remove these indices from P and update QR decomposition
      _remFromP(remIdx);
    }
  }
}